

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

string * __thiscall
chrono::ChValueSpecific<chrono::ChBezierCurve>::GetClassRegisteredName_abi_cxx11_
          (ChValueSpecific<chrono::ChBezierCurve> *this)

{
  int iVar1;
  string *psVar2;
  allocator local_11;
  
  if (GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,"",&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    }
  }
  psVar2 = &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_;
  if (this->_ptr_to_val != (ChBezierCurve *)0x0) {
    psVar2 = ChClassFactory::GetClassTagName_abi_cxx11_((type_info *)&ChBezierCurve::typeinfo);
  }
  return psVar2;
}

Assistant:

virtual std::string& GetClassRegisteredName() {
          static std::string nostring("");
          if (!_ptr_to_val) {
              return nostring;
          }
          try {
              return ChClassFactory::GetClassTagName(typeid(*_ptr_to_val));
          }catch (const ChException &) {
              return nostring;
          }
        }